

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall hwnet::TCPSocket::sendContext::sendContext(sendContext *this,Ptr *buff,size_t len)

{
  element_type *peVar1;
  
  std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             &buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->ptr = ((peVar1->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ptr + peVar1->b;
  this->next = (sendContext *)0x0;
  if (len == 0) {
    len = peVar1->len;
  }
  this->len = len;
  return;
}

Assistant:

sendContext(const Buffer::Ptr &buff,size_t len = 0):buff(buff),ptr(buff->BuffPtr()),next(nullptr){
			if(len > 0) {
				this->len = len;
			} else {
				this->len = buff->Len();
			}
		}